

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall FxMinusSign::FxMinusSign(FxMinusSign *this,FxExpression *operand)

{
  FxExpression *operand_local;
  FxMinusSign *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_MinusSign,&operand->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxMinusSign_00a09f68;
  this->Operand = operand;
  return;
}

Assistant:

FxMinusSign::FxMinusSign(FxExpression *operand)
: FxExpression(EFX_MinusSign, operand->ScriptPosition)
{
	Operand=operand;
}